

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O3

EC_T_CHAR * ESCTypeText(EC_T_BYTE byESCType)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,byESCType);
  if (iVar1 < 0x90) {
    if (iVar1 < 0x11) {
      if (iVar1 == 1) {
        return "Beckhoff ELs (Old)";
      }
      if (iVar1 == 2) {
        return "Beckhoff FPGA ESC 10/20";
      }
      if (iVar1 == 4) {
        return "IPCORE";
      }
    }
    else {
      switch(iVar1) {
      case 0x80:
        return "Hilscher NetX 100/500";
      case 0x81:
        return "Hilscher NetX 50";
      case 0x82:
        return "Hilscher NetX 5";
      case 0x83:
        return "Hilscher NetX 51/52";
      }
      if (iVar1 == 0x11) {
        return "Beckhoff ET1100";
      }
      if (iVar1 == 0x12) {
        return "Beckhoff ET1200";
      }
    }
  }
  else if (iVar1 < 0xa8) {
    if (iVar1 == 0x90) {
      return "Texas Instruments";
    }
    if (iVar1 == 0x98) {
      return "Infineon";
    }
    if (iVar1 == 0xa0) {
      return "Renesas";
    }
  }
  else if (iVar1 < 0xc0) {
    if (iVar1 == 0xa8) {
      return "Innovasic";
    }
    if (iVar1 == 0xb0) {
      return "HMS";
    }
  }
  else {
    if (iVar1 == 0xc0) {
      return "Microchip";
    }
    if (iVar1 == 0xd0) {
      return "Trinamic";
    }
  }
  return "Unknown Slave Controller";
}

Assistant:

EC_T_CHAR* ESCTypeText(
    EC_T_BYTE   byESCType   /**< [in]   ESC Type value from Slave Register Offset 0x00 */
                                     )
{
    EC_T_CHAR*      pszRet = EC_NULL;

    switch( byESCType )
    {
    case ESCTYPE_BKHF_ELOLD:            pszRet  = (EC_T_CHAR*)"Beckhoff ELs (Old)"; break;
    case ESCTYPE_ESC10|ESCTYPE_ESC20:   pszRet  = (EC_T_CHAR*)"Beckhoff FPGA ESC 10/20"; break;
    case ESCTYPE_IPCORE:                pszRet  = (EC_T_CHAR*)"IPCORE"; break;
    case ESCTYPE_ET1100:                pszRet  = (EC_T_CHAR*)"Beckhoff ET1100"; break;
    case ESCTYPE_ET1200:                pszRet  = (EC_T_CHAR*)"Beckhoff ET1200"; break;
    case ESCTYPE_NETX100_500:           pszRet  = (EC_T_CHAR*)"Hilscher NetX 100/500"; break;
    case ESCTYPE_NETX50:                pszRet  = (EC_T_CHAR*)"Hilscher NetX 50"; break;
    case ESCTYPE_NETX5:                 pszRet  = (EC_T_CHAR*)"Hilscher NetX 5"; break;
    case ESCTYPE_NETX51_52:             pszRet  = (EC_T_CHAR*)"Hilscher NetX 51/52"; break;
    case ESCTYPE_TI:                    pszRet  = (EC_T_CHAR*)"Texas Instruments"; break;
    case ESCTYPE_INFINEON:              pszRet  = (EC_T_CHAR*)"Infineon"; break;
    case ESCTYPE_RENESAS:               pszRet  = (EC_T_CHAR*)"Renesas"; break;
    case ESCTYPE_INNOVASIC:             pszRet  = (EC_T_CHAR*)"Innovasic"; break;
    case ESCTYPE_HMS:                   pszRet  = (EC_T_CHAR*)"HMS"; break;
    case ESCTYPE_MICROCHIP:             pszRet  = (EC_T_CHAR*)"Microchip"; break;
    case ESCTYPE_TRINAMIC:              pszRet  = (EC_T_CHAR*)"Trinamic"; break;
    default:                            pszRet  = (EC_T_CHAR*)"Unknown Slave Controller"; break;
    }

    return pszRet;
}